

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsInteractionTestUtil.cpp
# Opt level: O1

void deqp::gls::InteractionTestUtil::computeRandomRenderCommands
               (Random *rnd,ApiType apiType,int numCommands,int targetW,int targetH,
               vector<deqp::gls::InteractionTestUtil::RenderCommand,_std::allocator<deqp::gls::InteractionTestUtil::RenderCommand>_>
               *dst)

{
  pointer quad;
  
  std::
  vector<deqp::gls::InteractionTestUtil::RenderCommand,_std::allocator<deqp::gls::InteractionTestUtil::RenderCommand>_>
  ::resize(dst,(long)numCommands);
  for (quad = (dst->
              super__Vector_base<deqp::gls::InteractionTestUtil::RenderCommand,_std::allocator<deqp::gls::InteractionTestUtil::RenderCommand>_>
              )._M_impl.super__Vector_impl_data._M_start;
      quad != (dst->
              super__Vector_base<deqp::gls::InteractionTestUtil::RenderCommand,_std::allocator<deqp::gls::InteractionTestUtil::RenderCommand>_>
              )._M_impl.super__Vector_impl_data._M_finish; quad = quad + 1) {
    computeRandomRenderState(rnd,&quad->state,apiType,targetW,targetH);
    computeRandomQuad(rnd,&quad->quad,targetW,targetH);
  }
  return;
}

Assistant:

void computeRandomRenderCommands (de::Random& rnd, glu::ApiType apiType, int numCommands, int targetW, int targetH, vector<RenderCommand>& dst)
{
	DE_ASSERT(dst.empty());

	dst.resize(numCommands);
	for (vector<RenderCommand>::iterator cmd = dst.begin(); cmd != dst.end(); cmd++)
	{
		computeRandomRenderState(rnd, cmd->state, apiType, targetW, targetH);
		computeRandomQuad(rnd, cmd->quad, targetW, targetH);
	}
}